

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void arm::display_reg_name(ostream *o,Reg r)

{
  RegisterKind RVar1;
  uint32_t uVar2;
  ostream *poVar3;
  Reg in_ESI;
  ostream *in_RDI;
  
  if (in_ESI == 0xd) {
    std::operator<<(in_RDI,"sp");
  }
  else if (in_ESI == 0xe) {
    std::operator<<(in_RDI,"lr");
  }
  else if (in_ESI == 0xf) {
    std::operator<<(in_RDI,"pc");
  }
  else {
    RVar1 = register_type(in_ESI);
    switch(RVar1) {
    case GeneralPurpose:
      poVar3 = std::operator<<(in_RDI,"r");
      uVar2 = register_num(in_ESI);
      std::ostream::operator<<(poVar3,uVar2);
      break;
    case DoubleVector:
      poVar3 = std::operator<<(in_RDI,"d");
      uVar2 = register_num(in_ESI);
      std::ostream::operator<<(poVar3,uVar2);
      break;
    case QuadVector:
      poVar3 = std::operator<<(in_RDI,"q");
      uVar2 = register_num(in_ESI);
      std::ostream::operator<<(poVar3,uVar2);
      break;
    case VirtualGeneralPurpose:
      poVar3 = std::operator<<(in_RDI,"v");
      uVar2 = register_num(in_ESI);
      std::ostream::operator<<(poVar3,uVar2);
      break;
    case VirtualDoubleVector:
      poVar3 = std::operator<<(in_RDI,"vd");
      uVar2 = register_num(in_ESI);
      std::ostream::operator<<(poVar3,uVar2);
      break;
    case VirtualQuadVector:
      poVar3 = std::operator<<(in_RDI,"vq");
      uVar2 = register_num(in_ESI);
      std::ostream::operator<<(poVar3,uVar2);
    }
  }
  return;
}

Assistant:

void display_reg_name(std::ostream &o, Reg r) {
  if (r == REG_SP)
    o << "sp";
  else if (r == REG_LR)
    o << "lr";
  else if (r == REG_PC)
    o << "pc";
  else
    switch (register_type(r)) {
      case RegisterKind::GeneralPurpose:
        o << "r" << register_num(r);
        break;
      case RegisterKind::DoubleVector:
        o << "d" << register_num(r);
        break;
      case RegisterKind::QuadVector:
        o << "q" << register_num(r);
        break;
      case RegisterKind::VirtualGeneralPurpose:
        o << "v" << register_num(r);
        break;
      case RegisterKind::VirtualDoubleVector:
        o << "vd" << register_num(r);
        break;
      case RegisterKind::VirtualQuadVector:
        o << "vq" << register_num(r);
        break;
    }
}